

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O3

vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections_1)

{
  initializer_list<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>
  __l;
  allocator_type local_49;
  iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> local_48;
  istream_type *local_28;
  int local_20;
  undefined1 local_1c;
  istream_type *local_18;
  int local_10;
  undefined1 local_c;
  
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_stream =
       (collections->
       super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin._M_stream;
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_value =
       (collections->
       super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin._M_value;
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_ok =
       (collections->
       super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_Begin._M_ok;
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_stream =
       (collections->
       super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End._M_stream;
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_value =
       (collections->
       super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
       ).m_End._M_value;
  local_48.
  super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_ok = (collections->
                 super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
                 ).m_End._M_ok;
  local_28 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_stream;
  local_20 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_value;
  local_1c = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_ok;
  local_18 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_stream;
  local_10 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_value;
  local_c = (collections_1->
            super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
            ).m_End._M_ok;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::
  vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_49);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }